

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void __thiscall tinyexr::HeaderInfo::clear(HeaderInfo *this)

{
  long in_RDI;
  
  std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::clear
            ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x45ffd8);
  std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::clear
            ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)0x45ffe6);
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void clear() {
    channels.clear();
    attributes.clear();

    data_window.min_x = 0;
    data_window.min_y = 0;
    data_window.max_x = 0;
    data_window.max_y = 0;
    line_order = 0;
    display_window.min_x = 0;
    display_window.min_y = 0;
    display_window.max_x = 0;
    display_window.max_y = 0;
    screen_window_center[0] = 0.0f;
    screen_window_center[1] = 0.0f;
    screen_window_width = 0.0f;
    pixel_aspect_ratio = 0.0f;

    chunk_count = 0;

    // Tiled format
    tiled = 0;
    tile_size_x = 0;
    tile_size_y = 0;
    tile_level_mode = 0;
    tile_rounding_mode = 0;

    header_len = 0;
    compression_type = 0;

    name.clear();
    type.clear();
  }